

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

char Game::getch(void)

{
  int iVar1;
  undefined1 local_80 [7];
  char ch;
  termios new_settings;
  termios old_settings;
  
  memset(&new_settings.c_ispeed,0,0x3c);
  memset(local_80,0,0x3c);
  tcgetattr(0,(termios *)&new_settings.c_ispeed);
  memcpy(local_80,&new_settings.c_ispeed,0x3c);
  new_settings.c_oflag = new_settings.c_oflag & 0xfffffff5;
  tcsetattr(0,0,(termios *)local_80);
  iVar1 = getchar();
  tcsetattr(0,0,(termios *)&new_settings.c_ispeed);
  return (char)iVar1;
}

Assistant:

char Game::getch() {
    struct termios old_settings{}, new_settings{};

    tcgetattr(0, &old_settings); //grab old terminal i/o settings
    new_settings = old_settings; //make new settings same as old settings
    new_settings.c_lflag &= ~ICANON; //disable buffered i/o
    new_settings.c_lflag &= ~ECHO; //set echo mode
    tcsetattr(0, TCSANOW, &new_settings); //apply terminal io settings

    char ch;
    ch = (char) getchar();

    tcsetattr(0, TCSANOW, &old_settings);

    return ch;
}